

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

Image * __thiscall nv::FloatImage::createImage(FloatImage *this,uint base_component,uint num)

{
  int iVar1;
  uint8 auVar2 [4];
  Image *pIVar3;
  int *piVar4;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar5;
  anon_union_4_2_12391d8d_for_Color32_0 local_50;
  int local_4c [3];
  float local_40;
  uint8 local_3c [4];
  float f;
  uint8 rgba [4];
  uint c;
  uint i;
  uint size;
  AutoPtr<nv::Image> local_20;
  AutoPtr<nv::Image> img;
  uint num_local;
  uint base_component_local;
  FloatImage *this_local;
  
  img.m_ptr._0_4_ = (float)num;
  img.m_ptr._4_4_ = base_component;
  if ((4 < num) &&
     (iVar1 = nvAbort("num <= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x5b,"Image *nv::FloatImage::createImage(uint, uint) const"), iVar1 == 1)) {
    raise(5);
  }
  if ((this->m_componentNum < img.m_ptr._4_4_ + (int)img.m_ptr._0_4_) &&
     (iVar1 = nvAbort("base_component + num <= m_componentNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x5c,"Image *nv::FloatImage::createImage(uint, uint) const"), iVar1 == 1)) {
    raise(5);
  }
  pIVar3 = (Image *)operator_new(0x18);
  Image::Image(pIVar3);
  AutoPtr<nv::Image>::AutoPtr(&local_20,pIVar3);
  pIVar3 = AutoPtr<nv::Image>::operator->(&local_20);
  Image::allocate(pIVar3,(uint)this->m_width,(uint)this->m_height);
  auVar2 = (uint8  [4])((uint)this->m_width * (uint)this->m_height);
  rgba[0] = '\0';
  rgba[1] = '\0';
  rgba[2] = '\0';
  rgba[3] = '\0';
  for (; (uint)rgba < (uint)auVar2; rgba = (uint8  [4])((int)rgba + 1)) {
    local_3c[0] = '\0';
    local_3c[1] = '\0';
    local_3c[2] = '\0';
    local_3c[3] = 0xff;
    for (f = 0.0; (uint)f < (uint)img.m_ptr._0_4_; f = (float)((int)f + 1)) {
      local_40 = this->m_mem[(int)auVar2 * (img.m_ptr._4_4_ + (int)f) + (int)rgba];
      local_4c[2] = (int)(local_40 * 255.0);
      local_4c[1] = 0;
      local_4c[0] = 0xff;
      piVar4 = clamp<int>(local_4c + 2,local_4c + 1,local_4c);
      local_3c[(uint)f] = (uint8)*piVar4;
    }
    Color32::Color32((Color32 *)&local_50.field_0,local_3c[0],local_3c[1],local_3c[2],local_3c[3]);
    pIVar3 = AutoPtr<nv::Image>::operator->(&local_20);
    paVar5 = &Image::pixel(pIVar3,(uint)rgba)->field_0;
    *paVar5 = local_50;
  }
  pIVar3 = AutoPtr<nv::Image>::release(&local_20);
  AutoPtr<nv::Image>::~AutoPtr(&local_20);
  return pIVar3;
}

Assistant:

Image * FloatImage::createImage(uint base_component/*= 0*/, uint num/*= 4*/) const
{
	nvCheck(num <= 4);
	nvCheck(base_component + num <= m_componentNum);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++) {
		
		uint c;
		uint8 rgba[4]= {0, 0, 0, 0xff};

		for(c = 0; c < num; c++) {
			float f = m_mem[size * (base_component + c) + i];
			rgba[c] = nv::clamp(int(255.0f * f), 0, 255);
		}

		img->pixel(i) = Color32(rgba[0], rgba[1], rgba[2], rgba[3]);
	}
	
	return img.release();
}